

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_Test::testBody
          (TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_Test *this)

{
  MemoryLeakDetector *this_00;
  SimpleString *pSVar1;
  bool bVar2;
  TestMemoryAllocator *allocator;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  char a;
  SimpleString local_38;
  
  this_00 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  allocator = defaultMallocAllocator();
  MemoryLeakDetector::deallocMemory(this_00,allocator,&a,"FREE.c",100,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pUVar3 = UtestShell::getCurrent();
  pSVar1 = ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).reporter)->message;
  SimpleString::SimpleString(&local_38,"Deallocating non-allocated memory");
  bVar2 = SimpleString::contains(pSVar1,&local_38);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar2,"CHECK",
             "reporter->message->contains(\"Deallocating non-allocated memory\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x110,pTVar4);
  SimpleString::~SimpleString(&local_38);
  pUVar3 = UtestShell::getCurrent();
  pSVar1 = ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).reporter)->message;
  SimpleString::SimpleString
            (&local_38,"   allocated at file: <unknown> line: 0 size: 0 type: unknown");
  bVar2 = SimpleString::contains(pSVar1,&local_38);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar2,"CHECK",
             "reporter->message->contains(\"   allocated at file: <unknown> line: 0 size: 0 type: unknown\")"
             ,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x111,pTVar4);
  SimpleString::~SimpleString(&local_38);
  pUVar3 = UtestShell::getCurrent();
  pSVar1 = ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).reporter)->message;
  SimpleString::SimpleString(&local_38,"   deallocated at file: FREE.c line: 100 type: free");
  bVar2 = SimpleString::contains(pSVar1,&local_38);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar2,"CHECK",
             "reporter->message->contains(\"   deallocated at file: FREE.c line: 100 type: free\")",
             0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x112,pTVar4);
  SimpleString::~SimpleString(&local_38);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, DeleteNonAlocatedMemory)
{
    char a;
    char* pa = &a;
    detector->deallocMemory(defaultMallocAllocator(), pa, "FREE.c", 100);
    detector->stopChecking();
    CHECK(reporter->message->contains("Deallocating non-allocated memory"));
    CHECK(reporter->message->contains("   allocated at file: <unknown> line: 0 size: 0 type: unknown"));
    CHECK(reporter->message->contains("   deallocated at file: FREE.c line: 100 type: free"));
}